

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.h
# Opt level: O0

bool __thiscall llvm::Triple::operator==(Triple *this,Triple *Other)

{
  bool local_19;
  Triple *Other_local;
  Triple *this_local;
  
  local_19 = false;
  if ((((this->Arch == Other->Arch) && (local_19 = false, this->SubArch == Other->SubArch)) &&
      (local_19 = false, this->Vendor == Other->Vendor)) &&
     ((local_19 = false, this->OS == Other->OS &&
      (local_19 = false, this->Environment == Other->Environment)))) {
    local_19 = this->ObjectFormat == Other->ObjectFormat;
  }
  return local_19;
}

Assistant:

bool operator==(const Triple &Other) const {
    return Arch == Other.Arch && SubArch == Other.SubArch &&
           Vendor == Other.Vendor && OS == Other.OS &&
           Environment == Other.Environment &&
           ObjectFormat == Other.ObjectFormat;
  }